

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

int highest_bit_set(lword x)

{
  int n;
  int h;
  int i;
  lword x_local;
  
  h = -1;
  x_local = x;
  for (i = 0; i < 0x40; i = i + 1) {
    if ((x_local & 1U) != 0) {
      h = i;
    }
    x_local = x_local >> 1;
  }
  return h;
}

Assistant:

int highest_bit_set(lword x)
/* return number of highest bit set */
{
  int i,h=-1,n=sizeof(lword)<<3;

  for (i=0; i<n; i++) {
    if (x & 1)
      h = i;
    x >>= 1;
  }
  return h;
}